

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMull<(moira::Instr)156,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  Ea<(moira::Mode)10,_4> src;
  Ea<(moira::Mode)10,_4> local_44;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar6 = (*this->_vptr_Moira[6])();
  uVar8 = uVar6 & 0xffff;
  Op<(moira::Mode)10,4>(&local_44,this,op & 7,addr);
  bVar10 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  pcVar9 = ":";
  if (bVar10) {
    pcVar9 = ",";
  }
  if ((uVar6 & 0x83f8) != 0 && bVar10) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)156,(moira::Mode)10,4>(this,str,addr,op);
  }
  else {
    cVar5 = 'm';
    lVar7 = 0;
    if ((uVar8 >> 0xb & 1) == 0) {
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "mulu"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
    else {
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "fdmuls"[lVar7 + 3];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = 'l';
    }
    else {
      cVar5 = '.';
      lVar7 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "$%x.l"[lVar7 + 4];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    StrWriter::operator<<(str,&local_44);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    if ((uVar8 >> 10 & 1) != 0) {
      StrWriter::operator<<(str,(Dn)(uVar6 & 7));
      cVar5 = *pcVar9;
      while (cVar5 != '\0') {
        pcVar9 = pcVar9 + 1;
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = *pcVar9;
      }
    }
    StrWriter::operator<<(str,(Dn)(uVar8 >> 0xc & 7));
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      cVar5 = ';';
      lVar7 = 1;
      do {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = cVar5;
        cVar5 = "trap%-2s  ; (2+)"[lVar7 + 10];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 7);
    }
  }
  return;
}

Assistant:

void
Moira::dasmMull(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::MULS>{} : str << Ins<Instr::MULU>{};
            str << Sz<S>{} << str.tab << src << Sep{};
            (ext & 1 << 10) ? str << dh << fill << dl : str << dl;
            str << Av<I, M, S>{};
    }
}